

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeTests.cpp
# Opt level: O3

void __thiscall
agge::tests::PathStrokeTests::TwoOutlinesAreGeneratedForPolygons(PathStrokeTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  join *pjVar3;
  FailedAssertion *pFVar4;
  long lVar5;
  size_t sVar6;
  undefined4 uVar7;
  double dVar8;
  stroke s;
  stroke local_830;
  undefined1 local_7d8 [8];
  undefined4 local_7d0;
  undefined8 local_7cc;
  undefined4 local_7c4;
  undefined8 local_7c0;
  undefined4 local_7b8;
  undefined8 local_7b4;
  undefined4 local_7ac;
  ulong local_7a8;
  undefined4 local_7a0;
  undefined8 local_79c;
  undefined4 local_794;
  undefined8 local_790;
  undefined4 local_788;
  undefined8 local_784;
  undefined4 local_77c;
  undefined8 local_778;
  undefined4 local_770;
  ulong local_76c;
  undefined4 local_764;
  undefined8 local_760;
  undefined4 local_758;
  undefined8 local_754;
  undefined4 local_74c;
  undefined8 local_748;
  undefined4 local_740;
  undefined8 local_73c;
  undefined4 local_734;
  ulong local_730;
  undefined4 local_728;
  undefined8 local_724;
  undefined4 local_71c;
  undefined8 local_718;
  undefined4 local_710;
  undefined8 local_70c;
  undefined4 local_704;
  undefined8 local_700;
  undefined4 local_6f8;
  ulong local_6f4;
  undefined4 local_6ec;
  undefined8 local_6e8;
  undefined4 local_6e0;
  undefined8 local_6dc;
  undefined4 local_6d4;
  undefined8 local_6d0;
  undefined4 local_6c8;
  undefined8 local_6c4;
  undefined4 local_6bc;
  undefined8 local_6b8;
  undefined4 local_6b0;
  ulong local_6ac;
  undefined4 local_6a4;
  undefined8 local_6a0;
  undefined4 local_698;
  undefined8 local_694;
  undefined4 local_68c;
  undefined8 local_688;
  undefined4 local_680;
  undefined8 local_67c;
  undefined4 local_674;
  ulong local_670;
  undefined4 local_668;
  undefined8 local_664;
  undefined4 local_65c;
  undefined8 local_658;
  undefined4 local_650;
  undefined8 local_64c;
  undefined4 local_644;
  undefined8 local_640;
  undefined4 local_638;
  ulong local_634;
  undefined4 local_62c;
  undefined8 local_628;
  undefined4 local_620;
  undefined8 local_61c;
  undefined4 local_614;
  undefined8 local_610;
  undefined4 local_608;
  undefined8 local_604;
  undefined4 local_5fc;
  ulong local_5f8;
  undefined4 local_5f0;
  undefined8 local_5ec;
  undefined4 local_5e4;
  undefined8 local_5e0;
  undefined4 local_5d8;
  undefined1 local_5c8 [8];
  int local_5c0;
  undefined8 local_5bc;
  undefined4 local_5b4;
  undefined8 local_5b0;
  int local_5a8;
  pointer local_5a4;
  int local_59c;
  pointer local_598;
  int local_590;
  pointer local_58c;
  int local_584;
  pointer local_580;
  int local_578;
  pointer local_574;
  int local_56c;
  pointer local_568;
  int local_560;
  pointer local_55c;
  int local_554;
  pointer local_550;
  int local_548;
  pointer local_544;
  int local_53c;
  pointer local_538;
  int local_530;
  pointer local_52c;
  int local_524;
  pointer local_520;
  int local_518;
  pointer local_514;
  int local_50c;
  pointer local_508;
  int local_500;
  pointer local_4fc;
  int local_4f4;
  pointer local_4f0;
  int local_4e8;
  pointer local_4e4;
  int local_4dc;
  pointer local_4d8;
  int local_4d0;
  pointer local_4cc;
  int local_4c4;
  pointer local_4c0;
  int local_4b8;
  pointer local_4b4;
  int local_4ac;
  pointer local_4a8;
  int local_4a0;
  pointer local_49c;
  int local_494;
  pointer local_490;
  int local_488;
  pointer local_484;
  int local_47c;
  pointer local_478;
  int local_470;
  pointer local_46c;
  int local_464;
  pointer local_460;
  int local_458;
  pointer local_454;
  int local_44c;
  pointer local_448;
  int local_440;
  pointer local_43c;
  int local_434;
  pointer local_430;
  int local_428;
  pointer local_424;
  int local_41c;
  pointer local_418;
  int local_410;
  pointer local_40c;
  int local_404;
  pointer local_400;
  int local_3f8;
  pointer local_3f4;
  int local_3ec;
  pointer local_3e8;
  int local_3e0;
  pointer local_3dc;
  int local_3d4;
  pointer local_3d0;
  int local_3c8;
  LocationInfo local_3c0;
  point local_398;
  undefined8 local_38c;
  undefined4 local_384;
  undefined8 local_380;
  undefined4 local_378;
  undefined8 local_374;
  undefined4 local_36c;
  undefined8 local_368;
  undefined4 local_360;
  undefined8 local_35c;
  undefined4 local_354;
  undefined8 local_350;
  undefined4 local_348;
  undefined8 local_344;
  undefined4 local_33c;
  undefined8 local_338;
  undefined4 local_330;
  undefined8 local_32c;
  undefined4 local_324;
  undefined8 local_320;
  undefined4 local_318;
  undefined8 local_314;
  undefined4 local_30c;
  undefined8 local_308;
  undefined4 local_300;
  undefined8 local_2fc;
  undefined4 local_2f4;
  ulong local_2f0;
  undefined4 local_2e8;
  undefined8 local_2e4;
  undefined4 local_2dc;
  undefined8 local_2d8;
  undefined4 local_2d0;
  undefined8 local_2cc;
  undefined4 local_2c4;
  undefined8 local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b4;
  undefined4 local_2ac;
  ulong local_2a8;
  undefined4 local_2a0;
  undefined8 local_29c;
  undefined4 local_294;
  undefined8 local_290;
  undefined4 local_288;
  undefined8 local_284;
  undefined4 local_27c;
  undefined8 local_278;
  undefined4 local_270;
  undefined8 local_26c;
  undefined4 local_264;
  undefined8 local_260;
  undefined4 local_258;
  undefined8 local_254;
  undefined4 local_24c;
  undefined8 local_248;
  undefined4 local_240;
  undefined8 local_23c;
  undefined4 local_234;
  undefined8 local_230;
  undefined4 local_228;
  undefined8 local_224;
  undefined4 local_21c;
  undefined8 local_218;
  undefined4 local_210;
  pointer local_208;
  int local_200;
  pointer local_1fc;
  int local_1f4;
  pointer local_1f0;
  int local_1e8;
  pointer local_1e4;
  int local_1dc;
  pointer local_1d8;
  int local_1d0;
  pointer local_1cc;
  int local_1c4;
  pointer local_1c0;
  int local_1b8;
  pointer local_1b4;
  int local_1ac;
  pointer local_1a8;
  int local_1a0;
  pointer local_19c;
  int local_194;
  pointer local_190;
  int local_188;
  pointer local_184;
  int local_17c;
  pointer local_178;
  int local_170;
  pointer local_16c;
  int local_164;
  pointer local_160;
  int local_158;
  pointer local_154;
  int local_14c;
  pointer local_148;
  int local_140;
  pointer local_13c;
  int local_134;
  pointer local_130;
  int local_128;
  pointer local_124;
  int local_11c;
  pointer local_118;
  int local_110;
  pointer local_10c;
  int local_104;
  pointer local_100;
  int local_f8;
  pointer local_f4;
  int local_ec;
  pointer local_e8;
  int local_e0;
  pointer local_dc;
  int local_d4;
  pointer local_d0;
  int local_c8;
  pointer local_c4;
  int local_bc;
  pointer local_b8;
  int local_b0;
  pointer local_ac;
  int local_a4;
  pointer local_a0;
  int local_98;
  pointer local_94;
  int local_8c;
  pointer local_88;
  int local_80;
  string local_70;
  string local_50;
  
  stroke::stroke(&local_830);
  stroke::add_vertex(&local_830,1.0,1.0,1);
  stroke::add_vertex(&local_830,4.0,5.0,2);
  stroke::add_vertex(&local_830,4.0,15.0,2);
  stroke::add_vertex(&local_830,0.0,0.0,0x30);
  sVar6 = this->amount_alive;
  this->amount_alive = sVar6 + 1;
  pjVar3 = (join *)operator_new(0x10);
  pjVar3[1]._vptr_join = (_func_int **)this;
  sVar6 = sVar6 + 2;
  this->amount_alive = sVar6;
  pjVar3->_vptr_join = (_func_int **)&PTR__counted_001c3138;
  if (local_830._join != (join *)0x0) {
    (*(local_830._join)->_vptr_join[1])();
    sVar6 = this->amount_alive;
  }
  this->amount_alive = sVar6 - 1;
  local_830._join = pjVar3;
  stroke::width(&local_830,2.0);
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_200 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_208 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_1f4 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_1fc = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_1e8 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_1f0 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_1dc = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_1e4 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_1d0 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_1d8 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_1c4 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_1cc = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_1b8 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_1c0 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_1ac = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_1b4 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_1a0 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_1a8 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_194 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_19c = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_188 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_190 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_17c = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_184 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_170 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_178 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_164 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_16c = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_158 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_160 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_14c = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_154 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_140 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_148 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_134 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_13c = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_128 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_130 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_11c = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_124 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_110 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_118 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_104 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_10c = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_f8 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_100 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_ec = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_f4 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_e0 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_e8 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_d4 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_dc = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_c8 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_d0 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_bc = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_c4 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_b0 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_b8 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_a4 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_ac = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_98 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_a0 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_8c = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_94 = (pointer)local_5c8;
  local_5c0 = 0;
  local_5c8 = (undefined1  [8])0x0;
  local_80 = stroke::vertex(&local_830,(real_t *)local_5c8,(real_t *)(local_5c8 + 4));
  local_88 = (pointer)local_5c8;
  dVar8 = sqrt(5.57859275551463e-315);
  local_398.y = SUB84(dVar8,0);
  local_398.x = 1.0;
  local_398.command = 1;
  local_38c = 0x4170000040800000;
  local_384 = 2;
  local_380 = 0x3f8000003f800000;
  local_378 = 2;
  local_374 = 0x40a0000040800000;
  local_36c = 2;
  local_368 = 0x40a00000;
  local_360 = 2;
  local_35c = 0x40a000003f800000;
  local_354 = 2;
  local_350 = 0x3f8000003f800000;
  local_348 = 2;
  local_344 = 0x40a0000040800000;
  local_33c = 2;
  local_338 = 0x4170000040800000;
  local_330 = 2;
  local_32c = 0x41200000;
  local_324 = 2;
  local_320 = 0x412000003f800000;
  local_318 = 2;
  local_314 = 0x40a0000040800000;
  local_30c = 2;
  local_308 = 0x4170000040800000;
  local_300 = 2;
  local_2fc = 0x3f8000003f800000;
  local_2f4 = 2;
  dVar8 = sqrt(5.57859275551463e-315);
  local_2f0 = (ulong)dVar8 & 0xffffffff;
  local_2e8 = 2;
  local_2e4 = 0;
  local_2dc = 0x30;
  local_2d8 = 0x40a000003f800000;
  local_2d0 = 1;
  local_2cc = 0x40a0000040800000;
  local_2c4 = 2;
  local_2c0 = 0x3f8000003f800000;
  local_2b8 = 2;
  local_2b4 = 0x4170000040800000;
  local_2ac = 2;
  dVar8 = sqrt(5.57859275551463e-315);
  local_2a8 = (ulong)dVar8 & 0xffffffff;
  local_2a0 = 2;
  dVar8 = sqrt(5.57859275551463e-315);
  local_29c = CONCAT44(SUB84(dVar8,0),0x3f800000);
  local_294 = 2;
  local_290 = 0x3f8000003f800000;
  local_288 = 2;
  local_284 = 0x4170000040800000;
  local_27c = 2;
  local_278 = 0x40a0000040800000;
  local_270 = 2;
  local_26c = 0x41200000;
  local_264 = 2;
  local_260 = 0x412000003f800000;
  local_258 = 2;
  local_254 = 0x4170000040800000;
  local_24c = 2;
  local_248 = 0x40a0000040800000;
  local_240 = 2;
  local_23c = 0x3f8000003f800000;
  local_234 = 2;
  local_230 = 0x40a00000;
  local_228 = 2;
  local_224 = 0;
  local_21c = 0x30;
  local_218 = 0;
  local_210 = 0;
  paVar1 = &local_3c0.filename.field_2;
  local_3c0.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_5c8,&local_3c0.filename,0x175);
  lVar5 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)((long)&local_398.x + lVar5),(point *)((long)&local_208 + lVar5));
    if (!bVar2) {
      pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_7d8 = (undefined1  [8])((long)&local_7cc + 4);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7d8,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar4,(string *)local_7d8,(LocationInfo *)local_5c8);
      __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar5 = lVar5 + 0xc;
  } while (lVar5 != 0x18c);
  if (local_5c8 != (undefined1  [8])((long)&local_5bc + 4)) {
    operator_delete((void *)local_5c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.filename._M_dataplus._M_p);
  }
  stroke::remove_all(&local_830);
  stroke::add_vertex(&local_830,1.0,1.0,1);
  stroke::add_vertex(&local_830,5.0,2.0,2);
  stroke::add_vertex(&local_830,4.0,6.0,2);
  stroke::add_vertex(&local_830,0.0,5.0,2);
  stroke::add_vertex(&local_830,0.0,0.0,0x30);
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_5c0 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_5c8 = local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_5b4 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_5bc = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_5a8 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_5b0 = local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_59c = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_5a4 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_590 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_598 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_584 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_58c = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_578 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_580 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_56c = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_574 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_560 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_568 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_554 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_55c = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_548 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_550 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_53c = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_544 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_530 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_538 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_524 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_52c = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_518 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_520 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_50c = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_514 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_500 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_508 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_4f4 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_4fc = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_4e8 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_4f0 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_4dc = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_4e4 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_4d0 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_4d8 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_4c4 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_4cc = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_4b8 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_4c0 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_4ac = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_4b4 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_4a0 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_4a8 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_494 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_49c = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_488 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_490 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_47c = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_484 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_470 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_478 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_464 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_46c = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_458 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_460 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_44c = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_454 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_440 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_448 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_434 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_43c = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_428 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_430 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_41c = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_424 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_410 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_418 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_404 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_40c = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_3f8 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_400 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_3ec = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_3f4 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_3e0 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_3e8 = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_3d4 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_3dc = (pointer)local_7d8;
  local_7d0 = 0;
  local_7d8 = (undefined1  [8])0x0;
  local_3c8 = stroke::vertex(&local_830,(real_t *)local_7d8,(real_t *)(local_7d8 + 4));
  local_3d0 = (pointer)local_7d8;
  dVar8 = sqrt(5.43191549518332e-315);
  uVar7 = SUB84(dVar8,0);
  local_7d8 = (undefined1  [8])CONCAT44(uVar7,0x3f800000);
  local_7d0 = 1;
  local_7cc = 0x40a0000000000000;
  local_7c4 = 2;
  local_7c0 = 0x3f8000003f800000;
  local_7b8 = 2;
  local_7b4 = 0x4000000040a00000;
  local_7ac = 2;
  local_7a8 = (ulong)dVar8 & 0xffffffff;
  local_7a0 = 2;
  local_79c = CONCAT44(uVar7,0x3f800000);
  local_794 = 2;
  local_790 = 0x3f8000003f800000;
  local_788 = 2;
  local_784 = 0x4000000040a00000;
  local_77c = 2;
  local_778 = 0x40c0000040800000;
  local_770 = 2;
  local_764 = 2;
  local_760 = CONCAT44(uVar7,0x3f800000);
  local_758 = 2;
  local_754 = 0x4000000040a00000;
  local_74c = 2;
  local_748 = 0x40c0000040800000;
  local_740 = 2;
  local_73c = 0x40a0000000000000;
  local_734 = 2;
  local_728 = 2;
  local_724 = CONCAT44(uVar7,0x3f800000);
  local_71c = 2;
  local_718 = 0x40c0000040800000;
  local_710 = 2;
  local_70c = 0x40a0000000000000;
  local_704 = 2;
  local_700 = 0x3f8000003f800000;
  local_6f8 = 2;
  local_6ec = 2;
  local_6e8 = 0;
  local_6e0 = 0x30;
  local_6dc = CONCAT44(uVar7,0x3f800000);
  local_6d4 = 1;
  local_6d0 = 0x4000000040a00000;
  local_6c8 = 2;
  local_6c4 = 0x3f8000003f800000;
  local_6bc = 2;
  local_6b8 = 0x40a0000000000000;
  local_6b0 = 2;
  local_6a4 = 2;
  local_6a0 = CONCAT44(uVar7,0x3f800000);
  local_698 = 2;
  local_694 = 0x3f8000003f800000;
  local_68c = 2;
  local_688 = 0x40a0000000000000;
  local_680 = 2;
  local_67c = 0x40c0000040800000;
  local_674 = 2;
  local_668 = 2;
  local_664 = CONCAT44(uVar7,0x3f800000);
  local_65c = 2;
  local_658 = 0x40a0000000000000;
  local_650 = 2;
  local_64c = 0x40c0000040800000;
  local_644 = 2;
  local_640 = 0x4000000040a00000;
  local_638 = 2;
  local_62c = 2;
  local_628 = CONCAT44(uVar7,0x3f800000);
  local_620 = 2;
  local_61c = 0x40c0000040800000;
  local_614 = 2;
  local_610 = 0x4000000040a00000;
  local_608 = 2;
  local_604 = 0x3f8000003f800000;
  local_5fc = 2;
  local_5f0 = 2;
  local_5ec = 0;
  local_5e4 = 0x30;
  local_5e0 = 0;
  local_5d8 = 0;
  local_76c = local_7a8;
  local_730 = local_7a8;
  local_6f4 = local_7a8;
  local_6ac = local_7a8;
  local_670 = local_7a8;
  local_634 = local_7a8;
  local_5f8 = local_7a8;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_3c0,&local_70,0x19e);
  lVar5 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)(local_7d8 + lVar5),(point *)(local_5c8 + lVar5));
    if (!bVar2) {
      pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar4,&local_50,&local_3c0);
      __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar5 = lVar5 + 0xc;
  } while (lVar5 != 0x204);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  stroke::~stroke(&local_830);
  return;
}

Assistant:

test( TwoOutlinesAreGeneratedForPolygons )
			{
				// INIT
				stroke s;

				move_to(s, 1.0f, 1.0f);
				line_to(s, 4.0f, 5.0f);
				line_to(s, 4.0f, 15.0f);
				end_poly(s, true);

				s.set_join(passthrough_join(amount_alive));
				s.width(2.0f);

				// ACT
				mocks::path::point points1[] = {
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s),
				};

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(1.0f, sqrt(205.0f)), lineto(4.0f, 15.0f), lineto(1.0f, 1.0f), lineto(4.0f, 5.0f), lineto(5.0f, 0.0f),
					lineto(1.0f, 5.0f), lineto(1.0f, 1.0f), lineto(4.0f, 5.0f), lineto(4.0f, 15.0f), lineto(10.0f, 0.0f),
					lineto(1.0f, 10.0f), lineto(4.0f, 5.0f), lineto(4.0f, 15.0f), lineto(1.0f, 1.0f), lineto(sqrt(205.0f), 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					moveto(1.0f, 5.0f), lineto(4.0f, 5.0f), lineto(1.0f, 1.0f), lineto(4.0f, 15.0f), lineto(sqrt(205.0f), 0.0f),
					lineto(1.0f, sqrt(205.0f)), lineto(1.0f, 1.0f), lineto(4.0f, 15.0f), lineto(4.0f, 5.0f), lineto(10.0f, 0.0f),
					lineto(1.0f, 10.0f), lineto(4.0f, 15.0f), lineto(4.0f, 5.0f), lineto(1.0f, 1.0f), lineto(5.0f, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, points1);

				// INIT
				s.remove_all();

				move_to(s, 1.0f, 1.0f);
				line_to(s, 5.0f, 2.0f);
				line_to(s, 4.0f, 6.0f);
				line_to(s, 0.0f, 5.0f);
				end_poly(s, true);

				// ACT
				mocks::path::point points2[] = {
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s),
				};

				// ASSERT
				real_t l = sqrt(17.0f);
				mocks::path::point reference2[] = {
					moveto(1.0f, l), lineto(0.0f, 5.0f), lineto(1.0f, 1.0f), lineto(5.0f, 2.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(1.0f, 1.0f), lineto(5.0f, 2.0f), lineto(4.0f, 6.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(5.0f, 2.0f), lineto(4.0f, 6.0f), lineto(0.0f, 5.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(4.0f, 6.0f), lineto(0.0f, 5.0f), lineto(1.0f, 1.0f), lineto(l, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					moveto(1.0f, l), lineto(5.0f, 2.0f), lineto(1.0f, 1.0f), lineto(0.0f, 5.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(1.0f, 1.0f), lineto(0.0f, 5.0f), lineto(4.0f, 6.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(0.0f, 5.0f), lineto(4.0f, 6.0f), lineto(5.0f, 2.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(4.0f, 6.0f), lineto(5.0f, 2.0f), lineto(1.0f, 1.0f), lineto(l, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, points2);
			}